

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functor.hpp
# Opt level: O2

void __thiscall
Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>
::Functor(Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>
          *this)

{
  _Any_data local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  _Vector_base<double,_std::allocator<double>_> local_28;
  
  local_38 = 0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Functor(this,(Tf *)&local_48,(Tp *)&local_28,(cpTo)0x0);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  return;
}

Assistant:

Functor() : Functor(Tf{}, Tp{}) {}